

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

idx_t __thiscall
duckdb::StrfTimeFormat::GetLength(StrfTimeFormat *this,date_t date,int32_t *data,char *tz_name)

{
  StrTimeSpecifier *pSVar1;
  idx_t iVar2;
  idx_t iVar3;
  const_iterator __begin2;
  StrTimeSpecifier *pSVar4;
  
  iVar3 = (this->super_StrTimeFormat).constant_size;
  pSVar1 = (this->var_length_specifiers).
           super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
           super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar4 = (this->var_length_specifiers).
                super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
                super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
                ._M_impl.super__Vector_impl_data._M_start; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
    iVar2 = GetSpecifierLength(*pSVar4,date,data,tz_name);
    iVar3 = iVar3 + iVar2;
  }
  return iVar3;
}

Assistant:

idx_t StrfTimeFormat::GetLength(date_t date, int32_t data[8], const char *tz_name) const {
	idx_t size = constant_size;
	if (!var_length_specifiers.empty()) {
		for (auto &specifier : var_length_specifiers) {
			size += GetSpecifierLength(specifier, date, data, tz_name);
		}
	}
	return size;
}